

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O1

void __thiscall avro::json::JsonGenerator::objectStart(JsonGenerator *this)

{
  _Elt_pointer pSVar1;
  uint8_t *puVar2;
  
  sep(this);
  pSVar1 = (this->stateStack).c.
           super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->stateStack).c.
                super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<avro::json::JsonGenerator::State,std::allocator<avro::json::JsonGenerator::State>>::
    _M_push_back_aux<avro::json::JsonGenerator::State_const&>
              ((deque<avro::json::JsonGenerator::State,std::allocator<avro::json::JsonGenerator::State>>
                *)&this->stateStack,&this->top);
  }
  else {
    *pSVar1 = this->top;
    (this->stateStack).c.
    super__Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar1 + 1;
  }
  this->top = stMap0;
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar2 = (this->out_).next_;
  (this->out_).next_ = puVar2 + 1;
  *puVar2 = '{';
  return;
}

Assistant:

void objectStart() {
        sep();
        stateStack.push(top);
        top = stMap0;
        out_.write('{');
    }